

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void test_exhaustive_addition(secp256k1_ge *group,secp256k1_gej *groupj)

{
  int iVar1;
  long in_RSI;
  secp256k1_gej tmpj;
  secp256k1_ge tmp_2;
  secp256k1_gej tmp_1;
  secp256k1_gej tmp;
  secp256k1_ge zless_gej;
  secp256k1_fe fe_inv;
  uint64_t iter;
  int j;
  int i;
  secp256k1_gej *in_stack_fffffffffffffd18;
  secp256k1_gej *in_stack_fffffffffffffd20;
  secp256k1_ge *in_stack_fffffffffffffd40;
  secp256k1_ge *in_stack_fffffffffffffd48;
  secp256k1_gej *in_stack_fffffffffffffda8;
  secp256k1_gej *in_stack_fffffffffffffdb0;
  secp256k1_fe *in_stack_fffffffffffffef8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  secp256k1_gej *in_stack_ffffffffffffff08;
  secp256k1_gej *in_stack_ffffffffffffff10;
  secp256k1_fe *in_stack_ffffffffffffff28;
  secp256k1_gej *in_stack_ffffffffffffff30;
  secp256k1_gej *in_stack_ffffffffffffff38;
  secp256k1_gej *in_stack_ffffffffffffff40;
  undefined1 local_b8 [48];
  undefined1 auStack_88 [16];
  secp256k1_fe *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_gej *in_stack_ffffffffffffff98;
  secp256k1_gej *in_stack_ffffffffffffffa0;
  uint64_t local_20;
  int local_18;
  int local_14;
  long local_10;
  
  local_20 = 0;
  local_10 = in_RSI;
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1108c0);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
            ,0x4f,"test condition failed: secp256k1_ge_is_infinity(&group[0])");
    abort();
  }
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x110918);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
            ,0x50,"test condition failed: secp256k1_gej_is_infinity(&groupj[0])");
    abort();
  }
  local_14 = 1;
  while( true ) {
    if (0xc < local_14) {
      local_18 = 0;
      do {
        if (0xc < local_18) {
          local_14 = 0;
          while( true ) {
            if (0xc < local_14) {
              local_14 = 1;
              while( true ) {
                if (0xc < local_14) {
                  return;
                }
                secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffd20,
                                 (secp256k1_ge *)in_stack_fffffffffffffd18);
                iVar1 = secp256k1_ge_eq_var(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
                if (iVar1 == 0) break;
                secp256k1_gej_neg(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
                iVar1 = secp256k1_gej_eq_ge_var
                                  (in_stack_fffffffffffffdb0,
                                   (secp256k1_ge *)in_stack_fffffffffffffda8);
                if (iVar1 == 0) {
                  fprintf(_stderr,"%s:%d: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                          ,0x82,
                          "test condition failed: secp256k1_gej_eq_ge_var(&tmpj, &group[EXHAUSTIVE_TEST_ORDER - i])"
                         );
                  abort();
                }
                local_14 = local_14 + 1;
              }
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                      ,0x80,
                      "test condition failed: secp256k1_ge_eq_var(&tmp, &group[EXHAUSTIVE_TEST_ORDER - i])"
                     );
              abort();
            }
            secp256k1_gej_double(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
            iVar1 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8);
            if (iVar1 == 0) break;
            secp256k1_gej_double_var
                      (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,(secp256k1_fe *)0x110f7a)
            ;
            iVar1 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                      ,0x78,
                      "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(2 * i) % EXHAUSTIVE_TEST_ORDER])"
                     );
              abort();
            }
            local_14 = local_14 + 1;
          }
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                  ,0x76,
                  "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(2 * i) % EXHAUSTIVE_TEST_ORDER])"
                 );
          abort();
        }
        iVar1 = skip_section(&local_20);
        if (iVar1 == 0) {
          secp256k1_fe_inv(&in_stack_fffffffffffffd20->x,&in_stack_fffffffffffffd18->x);
          for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
            secp256k1_gej_add_var
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30
                       ,in_stack_ffffffffffffff28);
            iVar1 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                      ,0x60,
                      "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                     );
              abort();
            }
            if (0 < local_18) {
              secp256k1_gej_add_ge
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
              iVar1 = secp256k1_gej_eq_ge_var
                                (in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8
                                );
              if (iVar1 == 0) {
                fprintf(_stderr,"%s:%d: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                        ,100,
                        "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                       );
                abort();
              }
            }
            secp256k1_gej_add_ge_var
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
                       ,in_stack_fffffffffffffef8);
            iVar1 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                      ,0x68,
                      "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                     );
              abort();
            }
            memcpy(local_b8,(void *)(local_10 + (long)local_18 * 0x98),0x30);
            memcpy(auStack_88,(void *)(local_10 + (long)local_18 * 0x98 + 0x30),0x30);
            secp256k1_gej_add_zinv_var
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                       ,in_stack_ffffffffffffff88);
            iVar1 = secp256k1_gej_eq_ge_var
                              (in_stack_fffffffffffffdb0,(secp256k1_ge *)in_stack_fffffffffffffda8);
            if (iVar1 == 0) {
              fprintf(_stderr,"%s:%d: %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
                      ,0x6e,
                      "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER])"
                     );
              abort();
            }
          }
        }
        local_18 = local_18 + 1;
      } while( true );
    }
    iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x110998);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
              ,0x52,"test condition failed: !secp256k1_ge_is_infinity(&group[i])");
      abort();
    }
    iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x110a04);
    if (iVar1 != 0) break;
    local_14 = local_14 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests_exhaustive.c"
          ,0x53,"test condition failed: !secp256k1_gej_is_infinity(&groupj[i])");
  abort();
}

Assistant:

static void test_exhaustive_addition(const secp256k1_ge *group, const secp256k1_gej *groupj) {
    int i, j;
    uint64_t iter = 0;

    /* Sanity-check (and check infinity functions) */
    CHECK(secp256k1_ge_is_infinity(&group[0]));
    CHECK(secp256k1_gej_is_infinity(&groupj[0]));
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
        CHECK(!secp256k1_ge_is_infinity(&group[i]));
        CHECK(!secp256k1_gej_is_infinity(&groupj[i]));
    }

    /* Check all addition formulae */
    for (j = 0; j < EXHAUSTIVE_TEST_ORDER; j++) {
        secp256k1_fe fe_inv;
        if (skip_section(&iter)) continue;
        secp256k1_fe_inv(&fe_inv, &groupj[j].z);
        for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_ge zless_gej;
            secp256k1_gej tmp;
            /* add_var */
            secp256k1_gej_add_var(&tmp, &groupj[i], &groupj[j], NULL);
            CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER]));
            /* add_ge */
            if (j > 0) {
                secp256k1_gej_add_ge(&tmp, &groupj[i], &group[j]);
                CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER]));
            }
            /* add_ge_var */
            secp256k1_gej_add_ge_var(&tmp, &groupj[i], &group[j], NULL);
            CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER]));
            /* add_zinv_var */
            zless_gej.infinity = groupj[j].infinity;
            zless_gej.x = groupj[j].x;
            zless_gej.y = groupj[j].y;
            secp256k1_gej_add_zinv_var(&tmp, &groupj[i], &zless_gej, &fe_inv);
            CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i + j) % EXHAUSTIVE_TEST_ORDER]));
        }
    }

    /* Check doubling */
    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        secp256k1_gej tmp;
        secp256k1_gej_double(&tmp, &groupj[i]);
        CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(2 * i) % EXHAUSTIVE_TEST_ORDER]));
        secp256k1_gej_double_var(&tmp, &groupj[i], NULL);
        CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(2 * i) % EXHAUSTIVE_TEST_ORDER]));
    }

    /* Check negation */
    for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
        secp256k1_ge tmp;
        secp256k1_gej tmpj;
        secp256k1_ge_neg(&tmp, &group[i]);
        CHECK(secp256k1_ge_eq_var(&tmp, &group[EXHAUSTIVE_TEST_ORDER - i]));
        secp256k1_gej_neg(&tmpj, &groupj[i]);
        CHECK(secp256k1_gej_eq_ge_var(&tmpj, &group[EXHAUSTIVE_TEST_ORDER - i]));
    }
}